

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhotonMap.cpp
# Opt level: O1

void __thiscall
PhotonMap::query(PhotonMap *this,int u,int dim,vector<int,_std::allocator<int>_> *res,Vector3 *P,
                double R)

{
  Ray *pRVar1;
  pointer pPVar2;
  iterator __position;
  double *pdVar3;
  double dVar4;
  Vector3 Pu;
  int local_6c;
  double local_68;
  double local_60;
  Vector3 local_58;
  Vector3 local_40;
  
  if (u != 0) {
    pPVar2 = (this->photons).super__Vector_base<Photon,_std::allocator<Photon>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58.z = pPVar2[u].ray.O.z;
    pRVar1 = &pPVar2[u].ray;
    local_58.x = (pRVar1->O).x;
    local_58.y = (pRVar1->O).y;
    local_6c = u;
    local_68 = R;
    operator-(&local_58,P);
    dVar4 = Vector3::len2(&local_40);
    if (dVar4 <= local_68 * local_68) {
      __position._M_current =
           (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)res,__position,&local_6c);
      }
      else {
        *__position._M_current = local_6c;
        (res->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    pdVar3 = Vector3::operator[](&local_58,dim);
    local_60 = *pdVar3;
    pdVar3 = Vector3::operator[](P,dim);
    if (local_60 - *pdVar3 <= local_68) {
      query(this,(this->nodes).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
                 super__Vector_impl_data._M_start[local_6c].r,(dim + 1) % 3,res,P,local_68);
    }
    pdVar3 = Vector3::operator[](P,dim);
    local_60 = *pdVar3;
    pdVar3 = Vector3::operator[](&local_58,dim);
    if (local_60 - *pdVar3 <= local_68) {
      query(this,(this->nodes).super__Vector_base<Info,_std::allocator<Info>_>._M_impl.
                 super__Vector_impl_data._M_start[local_6c].l,(dim + 1) % 3,res,P,local_68);
    }
  }
  return;
}

Assistant:

void PhotonMap::query(int u, int dim, std::vector<int> &res, const Vector3 &P, double R) const
{
    if (!u) return;
    Vector3 Pu = photons[u].ray.O;
    double dis2 = (Pu - P).len2();
    if (dis2 <= R * R) res.push_back(u);
    if (Pu[dim] - P[dim] <= R) query(nodes[u].r, (dim + 1) % 3, res, P, R);
    if (P[dim] - Pu[dim] <= R) query(nodes[u].l, (dim + 1) % 3, res, P, R);
}